

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

optional<unsigned_long>
slang::parseInt<unsigned_long>(string_view name,string_view value,string *error)

{
  _Storage<unsigned_long,_true> extraout_RAX;
  char *__first;
  size_t sVar1;
  undefined8 uVar2;
  _Alloc_hider p;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  __integer_from_chars_result_type<unsigned_long> _Var3;
  optional<unsigned_long> oVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  unsigned_long val;
  _Storage<unsigned_long,_true> local_80;
  string local_78;
  string local_58;
  
  __first = value._M_str;
  sVar1 = value._M_len;
  if (sVar1 == 0) {
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_78;
    local_78._M_dataplus._M_p = name._M_str;
    local_78._M_string_length = name._M_len;
    ::fmt::v11::vformat_abi_cxx11_(&local_58,(v11 *)"expected value for argument \'{}\'",fmt,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,&local_58);
    local_80._M_value = (unsigned_long)&local_58.field_2;
    local_78.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    p._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_dataplus._M_p != (pointer)local_80._M_value) {
LAB_001da9bf:
      operator_delete(p._M_p,(size_t)(local_78.field_2._M_allocated_capacity + 1));
      local_80 = extraout_RAX;
    }
  }
  else {
    _Var3 = std::from_chars<unsigned_long>(__first,__first + sVar1,&local_80._M_value,10);
    if ((_Var3.ec == 0) && (_Var3.ptr == __first + sVar1)) {
      uVar2 = CONCAT71(_Var3._9_7_,1);
      goto LAB_001da918;
    }
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x2c;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    local_58._M_dataplus._M_p = __first;
    local_58._M_string_length = sVar1;
    local_58.field_2._M_allocated_capacity = (size_type)name._M_str;
    local_58.field_2._8_8_ = name._M_len;
    ::fmt::v11::vformat_abi_cxx11_
              (&local_78,(v11 *)"invalid value \'{}\' for integer argument \'{}\'",fmt_00,args_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (error,&local_78);
    local_80._M_value = (unsigned_long)&local_78.field_2;
    p._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_dataplus._M_p != (pointer)local_80._M_value) goto LAB_001da9bf;
  }
  uVar2 = 0;
LAB_001da918:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar2;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_80._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static std::optional<T> parseInt(std::string_view name, std::string_view value,
                                 std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}